

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O1

bool __thiscall lzham::search_accelerator::find_len2_matches(search_accelerator *this)

{
  uint uVar1;
  uchar *puVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  if ((this->m_digram_hash).m_size == 0) {
    if (((this->m_digram_hash).m_capacity < 0x1000) &&
       (bVar6 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_digram_hash,0x1000,false,4,(object_mover)0x0
                           ,true), !bVar6)) {
      return false;
    }
    uVar7 = (this->m_digram_hash).m_size;
    memset((this->m_digram_hash).m_p + uVar7,0,(ulong)(0x1000 - uVar7) << 2);
    (this->m_digram_hash).m_size = 0x1000;
  }
  uVar7 = this->m_lookahead_size;
  uVar1 = (this->m_digram_next).m_size;
  if (uVar1 < uVar7) {
    if (((this->m_digram_next).m_capacity < uVar7) &&
       (bVar6 = elemental_vector::increase_capacity
                          ((elemental_vector *)&this->m_digram_next,uVar7,uVar1 + 1 == uVar7,4,
                           (object_mover)0x0,true), !bVar6)) {
      return false;
    }
    uVar1 = (this->m_digram_next).m_size;
    memset((this->m_digram_next).m_p + uVar1,0,(ulong)(uVar7 - uVar1) << 2);
    (this->m_digram_next).m_size = uVar7;
  }
  if ((int)this->m_lookahead_size < 2) {
    uVar9 = (ulong)(this->m_lookahead_size - 1);
  }
  else {
    uVar7 = this->m_max_dict_size_mask & this->m_lookahead_pos;
    puVar2 = (this->m_dict).m_p;
    puVar3 = (this->m_digram_hash).m_p;
    puVar4 = (this->m_digram_next).m_p;
    lVar8 = 0;
    do {
      iVar5 = (int)lVar8;
      uVar9 = (ulong)((uint)puVar2[uVar7 + 1 + iVar5] << 6 ^ (uint)puVar2[uVar7 + iVar5] << 2);
      puVar4[lVar8] = *(uint *)((long)puVar3 + uVar9);
      *(uint *)((long)puVar3 + uVar9) = this->m_lookahead_pos + iVar5;
      lVar8 = lVar8 + 1;
      uVar9 = (long)(int)this->m_lookahead_size - 1;
    } while (lVar8 < (long)uVar9);
  }
  (this->m_digram_next).m_p[uVar9 & 0xffffffff] = 0;
  return true;
}

Assistant:

bool search_accelerator::find_len2_matches()
   {
      enum { cDigramHashSize = 4096 };

      if (!m_digram_hash.size())
      {
         if (!m_digram_hash.try_resize(cDigramHashSize))
            return false;
      }

      if (m_digram_next.size() < m_lookahead_size)
      {
         if (!m_digram_next.try_resize(m_lookahead_size))
            return false;
      }

      uint lookahead_dict_pos = m_lookahead_pos & m_max_dict_size_mask;

      for (int lookahead_ofs = 0; lookahead_ofs < ((int)m_lookahead_size - 1); ++lookahead_ofs, ++lookahead_dict_pos)
      {
         uint c0 = m_dict[lookahead_dict_pos];
         uint c1 = m_dict[lookahead_dict_pos + 1];

         uint h = hash2_to_12(c0, c1) & (cDigramHashSize - 1);

         m_digram_next[lookahead_ofs] = m_digram_hash[h];
         m_digram_hash[h] = m_lookahead_pos + lookahead_ofs;
      }

      m_digram_next[m_lookahead_size - 1] = 0;

      return true;
   }